

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O1

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraSublimeTextGenerator> *this)

{
  cmExternalMakefileProjectGenerator *pcVar1;
  string local_40;
  
  pcVar1 = (cmExternalMakefileProjectGenerator *)operator_new(0x70);
  (pcVar1->SupportedGlobalGenerators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->SupportedGlobalGenerators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar1->SupportedGlobalGenerators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1->GlobalGenerator = (cmGlobalGenerator *)0x0;
  (pcVar1->Name)._M_dataplus._M_p = (pointer)&(pcVar1->Name).field_2;
  (pcVar1->Name)._M_string_length = 0;
  (pcVar1->Name).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmExternalMakefileProjectGenerator =
       (_func_int **)&PTR__cmExtraSublimeTextGenerator_005f3820;
  pcVar1[1].SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&pcVar1[1].SupportedGlobalGenerators.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar1[1].SupportedGlobalGenerators.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &pcVar1[1].SupportedGlobalGenerators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)&pcVar1[1]._vptr_cmExternalMakefileProjectGenerator = 0;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&local_40,&this->super_cmExternalMakefileProjectGeneratorFactory);
  std::__cxx11::string::_M_assign((string *)&pcVar1->Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const override
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }